

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_StringUtilities.cpp
# Opt level: O0

string * soul::makeIdentifierRemovingColons(string *__return_storage_ptr__,string *s)

{
  string_view firstReplacement;
  string_view firstToReplace;
  size_t in_stack_ffffffffffffff58;
  string *__return_storage_ptr___00;
  basic_string_view<char,_std::char_traits<char>_> local_78;
  basic_string_view<char,_std::char_traits<char>_> local_68;
  string local_58;
  string local_38;
  string *local_18;
  string *s_local;
  
  __return_storage_ptr___00 = __return_storage_ptr__;
  local_18 = s;
  s_local = __return_storage_ptr__;
  trimCharacterAtStart(&local_58,s,':');
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_68,"::");
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_78,"_");
  firstReplacement._M_str = (char *)__return_storage_ptr___00;
  firstReplacement._M_len = in_stack_ffffffffffffff58;
  firstToReplace._M_str = (char *)local_78._M_len;
  firstToReplace._M_len = (size_t)local_68._M_str;
  choc::text::replace<std::__cxx11::string>
            (&local_38,(text *)&local_58,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_68._M_len,
             firstToReplace,firstReplacement);
  makeSafeIdentifierName(__return_storage_ptr___00,&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  std::__cxx11::string::~string((string *)&local_58);
  return __return_storage_ptr__;
}

Assistant:

std::string makeIdentifierRemovingColons (std::string s)
{
    return makeSafeIdentifierName (choc::text::replace (trimCharacterAtStart (s, ':'), "::", "_"));
}